

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# difference_iterator.hpp
# Opt level: O2

difference_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::greater<void>_>
* __thiscall
burst::
make_difference_iterator<std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,std::greater<void>>
          (difference_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::greater<void>_>
           *__return_storage_ptr__,burst *this,undefined8 *minuend)

{
  difference_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::greater<void>_>
  ::difference_iterator
            (__return_storage_ptr__,*(undefined8 *)this,*(undefined8 *)(this + 8),*minuend,
             minuend[1]);
  return __return_storage_ptr__;
}

Assistant:

auto
        make_difference_iterator
        (
            ForwardRange1 && minuend,
            ForwardRange2 && subtrahend,
            Compare compare
        )
    {
        using std::begin;
        using std::end;
        return
            make_difference_iterator
            (
                begin(std::forward<ForwardRange1>(minuend)),
                end(std::forward<ForwardRange1>(minuend)),
                begin(std::forward<ForwardRange2>(subtrahend)),
                end(std::forward<ForwardRange2>(subtrahend)),
                compare
            );
    }